

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O1

void __thiscall
icu_63::HebrewCalendar::roll
          (HebrewCalendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (field == UCAL_MONTH) {
    iVar1 = Calendar::get(&this->super_Calendar,UCAL_MONTH,status);
    iVar2 = Calendar::get(&this->super_Calendar,UCAL_YEAR,status);
    iVar3 = (iVar2 * 0xc + 0x11) % 0x13;
    iVar5 = 0xc;
    if (iVar3 < 0) {
      iVar5 = -7;
    }
    iVar4 = amount % (int)(iVar3 < iVar5 ^ 0xd) + iVar1;
    if (iVar3 < iVar5) {
      if (((amount < 1) || (4 < iVar1)) || (iVar4 < 5)) {
        iVar4 = iVar4 - (uint)((5 < iVar1 && amount < 0) && iVar4 < 6);
      }
      else {
        iVar4 = iVar4 + 1;
      }
    }
    Calendar::set(&this->super_Calendar,UCAL_MONTH,(iVar4 + 0xd) % 0xd);
    (*(this->super_Calendar).super_UObject._vptr_UObject[0x2c])(this,5,status);
    return;
  }
  Calendar::roll(&this->super_Calendar,field,amount,status);
  return;
}

Assistant:

UBool HebrewCalendar::haveDefaultCentury() const
{
    return TRUE;
}